

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  bVar1 = std::operator==(lang,"C");
  if ((!bVar1) && (bVar1 = std::operator==(lang,"CXX"), !bVar1)) {
    return false;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_30,"CMAKE_C_COMPILER_ID",&local_91);
  pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_30);
  iVar2 = strcmp(pcVar3,"MSVC");
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"CMAKE_CXX_COMPILER_ID",&local_92);
    pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_50);
    iVar2 = strcmp(pcVar3,"MSVC");
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,"CMAKE_C_SIMULATE_ID",&local_93);
      pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_70);
      iVar2 = strcmp(pcVar3,"MSVC");
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        std::__cxx11::string::string((string *)&local_90,"CMAKE_CXX_SIMULATE_ID",&local_94);
        pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_90);
        iVar2 = strcmp(pcVar3,"MSVC");
        bVar1 = iVar2 == 0;
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  if (lang == "C" || lang == "CXX")
    {
    cmMakefile* mf = this->GetMakefile();
    return (
      strcmp(mf->GetSafeDefinition("CMAKE_C_COMPILER_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_C_SIMULATE_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID"), "MSVC") == 0
      );
    }
  return false;
}